

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O1

void __thiscall libchars::commands::deactivate_all_sets(commands *this)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (this->C_sets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->C_sets)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if (*(char *)&p_Var1[2]._M_parent == '\x01') {
      *(undefined2 *)&p_Var1[2]._M_parent = 0x100;
    }
  }
  return;
}

Assistant:

void commands::deactivate_all_sets()
    {
        //NOTE: C_set_default not deactivated
        command_sets_t::iterator csi = C_sets.begin();
        while (csi != C_sets.end()) {
            command_set &C_set = csi->second;
            C_set.deactivate();
            ++csi;
        }
    }